

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

BOOL __thiscall LASquadtree::get_intersected_cells(LASquadtree *this)

{
  size_type sVar1;
  LASquadtree *this_local;
  
  this->next_cell_index = 0;
  if (this->current_cells == (void *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this->current_cells);
    if (sVar1 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

BOOL LASquadtree::get_intersected_cells()
{
  next_cell_index = 0;
  if (current_cells == 0)
  {
    return FALSE;
  }
  if (((my_cell_vector*)current_cells)->size() == 0)
  {
    return FALSE;
  }
  return TRUE;
}